

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O3

int LZ4_compress_HC(char *src,char *dst,int srcSize,int dstCapacity,int compressionLevel)

{
  int iVar1;
  void *__s;
  LZ4_streamHC_t *LZ4_streamHCPtr;
  
  __s = malloc(0x40038);
  iVar1 = 0;
  if (((ulong)__s & 7) == 0 && __s != (void *)0x0) {
    memset(__s,0,0x40030);
    *(undefined2 *)((long)__s + 0x40024) = 9;
    iVar1 = LZ4_compress_HC_extStateHC_fastReset(__s,src,dst,srcSize,dstCapacity,compressionLevel);
  }
  free(__s);
  return iVar1;
}

Assistant:

int LZ4_compress_HC(const char* src, char* dst, int srcSize, int dstCapacity, int compressionLevel)
{
#if defined(LZ4HC_HEAPMODE) && LZ4HC_HEAPMODE==1
    LZ4_streamHC_t* const statePtr = (LZ4_streamHC_t*)ALLOC(sizeof(LZ4_streamHC_t));
#else
    LZ4_streamHC_t state;
    LZ4_streamHC_t* const statePtr = &state;
#endif
    int const cSize = LZ4_compress_HC_extStateHC(statePtr, src, dst, srcSize, dstCapacity, compressionLevel);
#if defined(LZ4HC_HEAPMODE) && LZ4HC_HEAPMODE==1
    FREEMEM(statePtr);
#endif
    return cSize;
}